

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapelinear.cpp
# Opt level: O3

TPZTransform<double> *
pzshape::TPZShapeLinear::ParametricTransform
          (TPZTransform<double> *__return_storage_ptr__,int transid)

{
  bool bVar1;
  bool bVar2;
  double local_20;
  
  TPZTransform<double>::TPZTransform(__return_storage_ptr__,1,1);
  bVar1 = (__return_storage_ptr__->fMult).super_TPZFMatrix<double>.super_TPZMatrix<double>.
          super_TPZBaseMatrix.fRow < 1;
  bVar2 = (__return_storage_ptr__->fMult).super_TPZFMatrix<double>.super_TPZMatrix<double>.
          super_TPZBaseMatrix.fCol < 1;
  if (transid == 0) {
    local_20 = 1.0;
    if (bVar2 || bVar1) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
  }
  else {
    local_20 = -1.0;
    if (bVar2 || bVar1) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
  }
  *(__return_storage_ptr__->fMult).super_TPZFMatrix<double>.fElem = local_20;
  return __return_storage_ptr__;
}

Assistant:

TPZTransform<REAL> TPZShapeLinear::ParametricTransform(int transid) {
        TPZTransform<REAL> trans(1,1);
        if (!transid) trans.Mult()(0,0) =  1;
        else          trans.Mult()(0,0) = -1;
        return trans;
    }